

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeSorterCompare(VdbeCursor *pCsr,Mem *pVal,int nKeyCol,int *pRes)

{
  int iVar1;
  int local_5c;
  void *pvStack_58;
  int nKey;
  void *pKey;
  KeyInfo *pKStack_48;
  int i;
  KeyInfo *pKeyInfo;
  UnpackedRecord *r2;
  VdbeSorter *pSorter;
  int *pRes_local;
  Mem *pMStack_20;
  int nKeyCol_local;
  Mem *pVal_local;
  VdbeCursor *pCsr_local;
  
  r2 = (UnpackedRecord *)(pCsr->uc).pSorter;
  pKeyInfo = (KeyInfo *)((VdbeSorter *)r2)->pUnpacked;
  pKStack_48 = pCsr->pKeyInfo;
  pSorter = (VdbeSorter *)pRes;
  pRes_local._4_4_ = nKeyCol;
  pMStack_20 = pVal;
  pVal_local = (Mem *)pCsr;
  if (pKeyInfo == (KeyInfo *)0x0) {
    pKeyInfo = (KeyInfo *)sqlite3VdbeAllocUnpackedRecord(pKStack_48);
    r2[2].pKeyInfo = pKeyInfo;
    if (pKeyInfo == (KeyInfo *)0x0) {
      return 7;
    }
    *(u16 *)&pKeyInfo->db = (u16)pRes_local._4_4_;
  }
  pvStack_58 = vdbeSorterRowkey((VdbeSorter *)r2,&local_5c);
  sqlite3VdbeRecordUnpack(pKStack_48,local_5c,pvStack_58,(UnpackedRecord *)pKeyInfo);
  pKey._4_4_ = 0;
  while( true ) {
    if (pRes_local._4_4_ <= pKey._4_4_) {
      iVar1 = sqlite3VdbeRecordCompare(pMStack_20->n,pMStack_20->z,(UnpackedRecord *)pKeyInfo);
      pSorter->mnPmaSize = iVar1;
      return 0;
    }
    if ((*(ushort *)(*(long *)&pKeyInfo->nAllField + (long)pKey._4_4_ * 0x38 + 8) & 1) != 0) break;
    pKey._4_4_ = pKey._4_4_ + 1;
  }
  pSorter->mnPmaSize = -1;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterCompare(
  const VdbeCursor *pCsr,         /* Sorter cursor */
  Mem *pVal,                      /* Value to compare to current sorter key */
  int nKeyCol,                    /* Compare this many columns */
  int *pRes                       /* OUT: Result of comparison */
){
  VdbeSorter *pSorter;
  UnpackedRecord *r2;
  KeyInfo *pKeyInfo;
  int i;
  void *pKey; int nKey;           /* Sorter key to compare pVal with */

  assert( pCsr->eCurType==CURTYPE_SORTER );
  pSorter = pCsr->uc.pSorter;
  r2 = pSorter->pUnpacked;
  pKeyInfo = pCsr->pKeyInfo;
  if( r2==0 ){
    r2 = pSorter->pUnpacked = sqlite3VdbeAllocUnpackedRecord(pKeyInfo);
    if( r2==0 ) return SQLITE_NOMEM_BKPT;
    r2->nField = nKeyCol;
  }
  assert( r2->nField==nKeyCol );

  pKey = vdbeSorterRowkey(pSorter, &nKey);
  sqlite3VdbeRecordUnpack(pKeyInfo, nKey, pKey, r2);
  for(i=0; i<nKeyCol; i++){
    if( r2->aMem[i].flags & MEM_Null ){
      *pRes = -1;
      return SQLITE_OK;
    }
  }

  *pRes = sqlite3VdbeRecordCompare(pVal->n, pVal->z, r2);
  return SQLITE_OK;
}